

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O3

void LCDWriteData(uint16_t usData)

{
  LCDWaitForReady();
  bcm2835_gpio_write('\b','\0');
  bcm2835_spi_transfer('\0');
  bcm2835_spi_transfer('\0');
  LCDWaitForReady();
  bcm2835_spi_transfer((uint8_t)(usData >> 8));
  bcm2835_spi_transfer((uint8_t)usData);
  bcm2835_gpio_write('\b','\x01');
  return;
}

Assistant:

void LCDWriteData(uint16_t usData)
{
	//Set Preamble for Write Data
	uint16_t wPreamble	= 0x0000;

	LCDWaitForReady();

	bcm2835_gpio_write(CS,LOW);

	bcm2835_spi_transfer(wPreamble>>8);
	bcm2835_spi_transfer(wPreamble);
	
	LCDWaitForReady();
			
	bcm2835_spi_transfer(usData>>8);
	bcm2835_spi_transfer(usData);
	
	bcm2835_gpio_write(CS,HIGH); 
}